

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O0

void __thiscall kj::_::ExceptionOr<kj::String>::~ExceptionOr(ExceptionOr<kj::String> *this)

{
  ExceptionOr<kj::String> *this_local;
  
  Maybe<kj::String>::~Maybe(&this->value);
  ExceptionOrValue::~ExceptionOrValue(&this->super_ExceptionOrValue);
  return;
}

Assistant:

ExceptionOr() = default;